

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O0

string * ApprovalTests::Scrubbers::doNothing(string *input)

{
  string *in_RSI;
  string *in_RDI;
  
  ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string doNothing(const std::string& input)
        {
            return input;
        }